

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getkey.c
# Opt level: O3

int ffghbn(fitsfile *fptr,int maxfield,long *naxis2,int *tfields,char **ttype,char **tform,
          char **tunit,char *extnm,long *pcount,int *status)

{
  char **value_00;
  int iVar1;
  ulong uVar2;
  uint nmax;
  LONGLONG pcountll;
  LONGLONG naxis2ll;
  LONGLONG naxis1ll;
  long fields;
  char xtension [71];
  char value [71];
  char comm [73];
  char name [75];
  uint local_204;
  char **local_200;
  char **local_1f8;
  long local_1f0;
  long local_1e8;
  LONGLONG local_1e0;
  uint local_1d8;
  undefined4 uStack_1d4;
  long local_178;
  char local_170;
  char local_128 [80];
  char local_d8 [80];
  long local_88;
  char local_80;
  
  iVar1 = *status;
  if (iVar1 < 1) {
    local_200 = ttype;
    local_1f8 = tform;
    ffgkyn(fptr,1,(char *)&local_88,local_128,local_d8,status);
    if (local_80 == '\0' && local_88 == 0x4e4f49534e455458) {
      iVar1 = ffc2s(local_128,(char *)&local_178,status);
      if (iVar1 < 1) {
        if ((local_128[0] != '\'') ||
           (((local_170 != '\0' || local_178 != 0x454c4241544e4942 &&
             (local_170 != '\0' || local_178 != 0x454c424154443341)) &&
            (local_178 != 0x454c4241544433)))) {
          snprintf((char *)&local_1d8,0x51,"This is not a BINTABLE extension: %s",local_128);
          ffpmsg((char *)&local_1d8);
          *status = 0xe3;
          return 0xe3;
        }
        iVar1 = ffgttb(fptr,&local_1e0,&local_1e8,&local_1f0,(long *)&local_1d8,status);
        value_00 = local_1f8;
        if (iVar1 < 1) {
          if (naxis2 != (long *)0x0) {
            *naxis2 = local_1e8;
          }
          if (pcount != (long *)0x0) {
            *pcount = local_1f0;
          }
          if (tfields != (int *)0x0) {
            *tfields = local_1d8;
          }
          nmax = local_1d8;
          if (-1 < maxfield) {
            uVar2 = (ulong)(uint)maxfield;
            if ((long)CONCAT44(uStack_1d4,local_1d8) < (long)(ulong)(uint)maxfield) {
              uVar2 = CONCAT44(uStack_1d4,local_1d8);
            }
            nmax = (uint)uVar2;
          }
          if (0 < (int)nmax) {
            uVar2 = 0;
            do {
              if (local_200 != (char **)0x0) {
                *local_200[uVar2] = '\0';
              }
              if (tunit != (char **)0x0) {
                *tunit[uVar2] = '\0';
              }
              uVar2 = uVar2 + 1;
            } while ((nmax & 0x7fffffff) != uVar2);
            if (local_200 != (char **)0x0) {
              ffgkns(fptr,"TTYPE",1,nmax,local_200,(int *)&local_204,status);
            }
            if (tunit != (char **)0x0) {
              ffgkns(fptr,"TUNIT",1,nmax,tunit,(int *)&local_204,status);
            }
            if (0 < *status) {
              return *status;
            }
            if ((value_00 != (char **)0x0) &&
               ((ffgkns(fptr,"TFORM",1,nmax,value_00,(int *)&local_204,status), 0 < *status ||
                (local_204 != nmax)))) {
              ffpmsg("Required TFORM keyword(s) not found in binary table header (ffghbn).");
              *status = 0xe8;
              return 0xe8;
            }
          }
          if (extnm == (char *)0x0) {
            return *status;
          }
          *extnm = '\0';
          iVar1 = *status;
          ffgkys(fptr,"EXTNAME",extnm,local_d8,status);
          if (*status != 0xca) {
            return *status;
          }
          *status = iVar1;
          return iVar1;
        }
      }
      else {
        ffpmsg("Bad value string for XTENSION keyword:");
        ffpmsg(local_128);
      }
      iVar1 = *status;
    }
    else {
      snprintf((char *)&local_1d8,0x51,"First keyword of the extension is not XTENSION: %s",
               &local_88);
      ffpmsg((char *)&local_1d8);
      *status = 0xe1;
      iVar1 = 0xe1;
    }
  }
  return iVar1;
}

Assistant:

int ffghbn(fitsfile *fptr,  /* I - FITS file pointer                        */
           int maxfield,    /* I - maximum no. of columns to read;          */
           long *naxis2,    /* O - number of rows in the table              */
           int *tfields,    /* O - number of columns in the table           */
           char **ttype,    /* O - name of each column                      */
           char **tform,    /* O - TFORMn value for each column             */
           char **tunit,    /* O - TUNITn value for each column             */
           char *extnm,     /* O - value of EXTNAME keyword, if any         */
           long *pcount,    /* O - value of PCOUNT keyword                  */
           int *status)     /* IO - error status                            */
/*
  Get keywords from the Header of the BiNary table:
  Check that the keywords conform to the FITS standard and return the
  parameters which describe the table.
*/
{
    int ii, maxf, nfound, tstatus;
    long  fields;
    char name[FLEN_KEYWORD], value[FLEN_VALUE], comm[FLEN_COMMENT];
    char xtension[FLEN_VALUE], message[FLEN_ERRMSG];
    LONGLONG naxis1ll, naxis2ll, pcountll;

    if (*status > 0)
        return(*status);

    /* read the first keyword of the extension */
    ffgkyn(fptr, 1, name, value, comm, status);

    if (!strcmp(name, "XTENSION"))
    {
            if (ffc2s(value, xtension, status) > 0)  /* get the value string */
            {
                ffpmsg("Bad value string for XTENSION keyword:");
                ffpmsg(value);
                return(*status);
            }

            /* allow the quoted string value to begin in any column and */
            /* allow any number of trailing blanks before the closing quote */
            if ( (value[0] != '\'')   ||  /* first char must be a quote */
                 ( strcmp(xtension, "BINTABLE") &&
                   strcmp(xtension, "A3DTABLE") &&
                   strcmp(xtension, "3DTABLE")
                 ) )
            {
                snprintf(message, FLEN_ERRMSG,
                "This is not a BINTABLE extension: %s", value);
                ffpmsg(message);
                return(*status = NOT_BTABLE);
            }
    }

    else  /* error: 1st keyword of extension != XTENSION */
    {
        snprintf(message, FLEN_ERRMSG,
        "First keyword of the extension is not XTENSION: %s", name);
        ffpmsg(message);
        return(*status = NO_XTENSION);
    }

    if (ffgttb(fptr, &naxis1ll, &naxis2ll, &pcountll, &fields, status) > 0)
        return(*status);

    if (naxis2)
       *naxis2 = (long) naxis2ll;

    if (pcount)
       *pcount = (long) pcountll;

    if (tfields)
        *tfields = fields;

    if (maxfield < 0)
        maxf = fields;
    else
        maxf = minvalue(maxfield, fields);

    if (maxf > 0)
    {
        for (ii = 0; ii < maxf; ii++)
        {   /* initialize optional keyword values */
            if (ttype)
                *ttype[ii] = '\0';   

            if (tunit)
                *tunit[ii] = '\0';
        }

        if (ttype)
            ffgkns(fptr, "TTYPE", 1, maxf, ttype, &nfound, status);

        if (tunit)
            ffgkns(fptr, "TUNIT", 1, maxf, tunit, &nfound, status);

        if (*status > 0)
            return(*status);

        if (tform)
        {
            ffgkns(fptr, "TFORM", 1, maxf, tform, &nfound, status);

            if (*status > 0 || nfound != maxf)
            {
                ffpmsg(
        "Required TFORM keyword(s) not found in binary table header (ffghbn).");
                return(*status = NO_TFORM);
            }
        }
    }

    if (extnm)
    {
        extnm[0] = '\0';

        tstatus = *status;
        ffgkys(fptr, "EXTNAME", extnm, comm, status);

        if (*status == KEY_NO_EXIST)
          *status = tstatus;  /* keyword not required, so ignore error */
    }
    return(*status);
}